

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall
Impl2T<poly::virtual_cloning_policy>::Impl2T
          (Impl2T<poly::virtual_cloning_policy> *this,bool throw_on_copy)

{
  double *__p;
  bool throw_on_copy_local;
  Impl2T<poly::virtual_cloning_policy> *this_local;
  
  Interface::Interface(&this->super_Interface,throw_on_copy);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cb620;
  poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::vector(&this->v)
  ;
  __p = (double *)operator_new__(0x448);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],std::default_delete<double[]>> *)&this->p,__p);
  Cookie::Cookie(&this->cookie);
  Cookie::set(&this->cookie);
  return;
}

Assistant:

explicit Impl2T(bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , p { new double[137] }
    {
        cookie.set();
    }